

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O1

int Gia_ManAreCubeCheckList(Gia_ManAre_t *p,Gia_PtrAre_t *pRoot,Gia_StaAre_t *pSta)

{
  Gia_PtrAre_t GVar1;
  uint *puVar2;
  byte bVar3;
  int i;
  uint uVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  bool bVar10;
  
  puVar2 = (uint *)((long)p->nSize * (ulong)((uint)*pRoot & 0xfffff) * 4 +
                   *(long *)((long)p->ppStas + (ulong)((uint)*pRoot >> 0x11 & 0x3ff8)));
  if (*p->ppStas == puVar2) {
    return 1;
  }
LAB_00696a7f:
  p->nChecks = p->nChecks + 1;
  if (-1 < (int)*puVar2) {
    iVar5 = p->nWords;
    lVar6 = (long)iVar5;
    if (0 < lVar6) {
      lVar7 = 0;
      do {
        uVar8 = puVar2[lVar7 + 2] ^ (uint)(&pSta[1].iPrev)[lVar7];
        if ((uVar8 >> 1 & uVar8 & 0x55555555) != 0) goto LAB_00696bfe;
        lVar7 = lVar7 + 1;
      } while (lVar6 != lVar7);
    }
    if (iVar5 < 1) {
LAB_00696c31:
      memset(pSta,0,(long)(p->nSize << 2));
      iVar5 = p->nStas;
      uVar8 = iVar5 - 1;
      if ((Gia_StaAre_t *)
          ((long)p->nSize * (ulong)(uVar8 & 0xfffff) * 4 +
          *(long *)((long)p->ppStas + (ulong)(uVar8 >> 0x11 & 0x3ff8))) != pSta) {
        return 0;
      }
      p->nStas = uVar8;
      if (iVar5 != p->nStaPages * 0x100000 + -0xfffff) {
        return 0;
      }
      p->nStaPages = p->nStaPages + -1;
      return 0;
    }
    lVar7 = 0;
    while ((puVar2[lVar7 + 2] & ~(uint)(&pSta[1].iPrev)[lVar7]) == 0) {
      lVar7 = lVar7 + 1;
      if (lVar6 == lVar7) goto LAB_00696c31;
    }
    if (0 < iVar5) {
      lVar7 = 0;
      do {
        if (((uint)(&pSta[1].iPrev)[lVar7] & ~puVar2[lVar7 + 2]) != 0) {
          if (0 < iVar5) {
            iVar9 = -1;
            lVar7 = 0;
            goto LAB_00696b18;
          }
          iVar5 = -1;
          goto LAB_00696b8e;
        }
        lVar7 = lVar7 + 1;
      } while (lVar6 != lVar7);
    }
    *puVar2 = *puVar2 | 0x80000000;
  }
  goto LAB_00696bfe;
LAB_00696b18:
  do {
    uVar8 = (puVar2[lVar7 + 2] >> 1 ^ puVar2[lVar7 + 2]) &
            ~((uint)(&pSta[1].iPrev)[lVar7] >> 1 ^ (uint)(&pSta[1].iPrev)[lVar7]) & 0x55555555;
    if (uVar8 != 0) {
      iVar5 = -1;
      if (((uVar8 & uVar8 - 1) != 0) || (-1 < iVar9)) break;
      uVar4 = 0;
      do {
        if ((uVar8 >> (uVar4 & 0x1f) & 1) != 0) goto LAB_00696b68;
        uVar4 = uVar4 + 1;
      } while (uVar4 != 0x20);
      uVar4 = 0xffffffff;
LAB_00696b68:
      iVar9 = (int)lVar7 * 0x10 + (int)uVar4 / 2;
    }
    lVar7 = lVar7 + 1;
    iVar5 = iVar9;
  } while (lVar7 != lVar6);
LAB_00696b8e:
  if (iVar5 != -1) {
    lVar6 = (long)(iVar5 * 2 >> 5);
    GVar1 = (&pSta[1].iPrev)[lVar6];
    uVar8 = iVar5 * 2 & 0x1e;
    if ((((uint)GVar1 >> uVar8 & 1) != 0) || (bVar3 = (byte)uVar8, ((uint)GVar1 >> bVar3 & 2) != 0))
    {
      __assert_fail("!Gia_StaHasValue0(pSta, iVar) && !Gia_StaHasValue1(pSta, iVar)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEra2.c"
                    ,0x3fa,
                    "int Gia_ManAreCubeCheckList(Gia_ManAre_t *, Gia_PtrAre_t *, Gia_StaAre_t *)");
    }
    bVar10 = (puVar2[lVar6 + 2] >> uVar8 & 1) != 0;
    if (bVar10 == ((puVar2[lVar6 + 2] >> (bVar3 | 1) & 1) != 0)) {
      __assert_fail("Gia_StaHasValue0(pCube, iVar) ^ Gia_StaHasValue1(pCube, iVar)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEra2.c"
                    ,0x3fb,
                    "int Gia_ManAreCubeCheckList(Gia_ManAre_t *, Gia_PtrAre_t *, Gia_StaAre_t *)");
    }
    if (bVar10) {
      uVar8 = 2 << bVar3;
    }
    else {
      uVar8 = 1 << uVar8;
    }
    (&pSta[1].iPrev)[lVar6] = (Gia_PtrAre_t)((uint)GVar1 | uVar8);
  }
LAB_00696bfe:
  puVar2 = (uint *)((long)p->nSize * (ulong)(puVar2[1] & 0xfffff) * 4 +
                   *(long *)((long)p->ppStas + (ulong)(puVar2[1] >> 0x11 & 0x3ff8)));
  if (*p->ppStas == puVar2) {
    return 1;
  }
  goto LAB_00696a7f;
}

Assistant:

static inline int Gia_ManAreCubeCheckList( Gia_ManAre_t * p, Gia_PtrAre_t * pRoot, Gia_StaAre_t * pSta )
{
    int fVerbose = 0;
    Gia_StaAre_t * pCube;
    int iVar;
if ( fVerbose )
{
printf( "Trying cube: " );
Gia_ManArePrintCube( p, pSta );
}
    Gia_ManAreForEachCubeList( p, Gia_ManAreSta(p, *pRoot), pCube )
    {
        p->nChecks++;
        if ( Gia_StaIsUnused( pCube ) )
            continue;
        if ( Gia_StaAreDisjoint( pSta, pCube, p->nWords ) )
            continue;
        if ( Gia_StaAreContain( pCube, pSta, p->nWords ) )
        {
if ( fVerbose )
{
printf( "Contained in " );
Gia_ManArePrintCube( p, pCube );
}
            Gia_ManAreRycycleSta( p, pSta );
            return 0;
        }
        if ( Gia_StaAreContain( pSta, pCube, p->nWords ) )
        {
if ( fVerbose )
{
printf( "Contains     " );
Gia_ManArePrintCube( p, pCube );
}
            Gia_StaSetUnused( pCube );
            continue;
        }
        iVar = Gia_StaAreSharpVar( pSta, pCube, p->nWords );
        if ( iVar == -1 )
            continue;
if ( fVerbose )
{
printf( "Sharped by   " );
Gia_ManArePrintCube( p, pCube );
Gia_ManArePrintCube( p, pSta );
}
//        printf( "%d  %d\n", Gia_StaAreDashNum( pSta, pCube, p->nWords ), Gia_StaAreSharpVar( pSta, pCube, p->nWords ) );
        assert( !Gia_StaHasValue0(pSta, iVar) && !Gia_StaHasValue1(pSta, iVar) );
        assert(  Gia_StaHasValue0(pCube, iVar) ^  Gia_StaHasValue1(pCube, iVar) );
        if ( Gia_StaHasValue0(pCube, iVar) )
            Gia_StaSetValue1( pSta, iVar );
        else
            Gia_StaSetValue0( pSta, iVar );
//        return Gia_ManAreCubeCheckList( p, pRoot, pSta );
    }
    return 1;
}